

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mimics_pcre.cc
# Opt level: O0

bool __thiscall
re2::EmptyStringWalker::PostVisit
          (EmptyStringWalker *this,Regexp *re,bool parent_arg,bool pre_arg,bool *child_args,
          int nchild_args)

{
  RegexpOp RVar1;
  int iVar2;
  bool local_49;
  int local_3c;
  int local_38;
  int i_1;
  int i;
  int nchild_args_local;
  bool *child_args_local;
  bool pre_arg_local;
  bool parent_arg_local;
  Regexp *re_local;
  EmptyStringWalker *this_local;
  
  RVar1 = Regexp::op(re);
  switch(RVar1) {
  case kRegexpNoMatch:
  case kRegexpLiteral:
  case kRegexpLiteralString:
  case kRegexpAnyChar:
  case kRegexpAnyByte:
  case kRegexpCharClass:
    this_local._7_1_ = false;
    break;
  case kRegexpEmptyMatch:
  case kRegexpStar:
  case kRegexpQuest:
  case kRegexpBeginLine:
  case kRegexpEndLine:
  case kRegexpWordBoundary:
  case kRegexpNoWordBoundary:
  case kRegexpBeginText:
  case kRegexpEndText:
  case kMaxRegexpOp:
    this_local._7_1_ = true;
    break;
  case kRegexpConcat:
    for (local_38 = 0; local_38 < nchild_args; local_38 = local_38 + 1) {
      if ((child_args[local_38] & 1U) == 0) {
        return false;
      }
    }
    this_local._7_1_ = true;
    break;
  case kRegexpAlternate:
    for (local_3c = 0; local_3c < nchild_args; local_3c = local_3c + 1) {
      if ((child_args[local_3c] & 1U) != 0) {
        return true;
      }
    }
    this_local._7_1_ = false;
    break;
  case kRegexpPlus:
  case kRegexpCapture:
    this_local._7_1_ = (bool)(*child_args & 1);
    break;
  case kRegexpRepeat:
    local_49 = true;
    if ((*child_args & 1U) == 0) {
      iVar2 = Regexp::min(re);
      local_49 = iVar2 == 0;
    }
    this_local._7_1_ = local_49;
    break;
  default:
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EmptyStringWalker::PostVisit(Regexp* re, bool parent_arg, bool pre_arg,
                                  bool* child_args, int nchild_args) {
  switch (re->op()) {
    case kRegexpNoMatch:               // never empty
    case kRegexpLiteral:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpCharClass:
    case kRegexpLiteralString:
      return false;

    case kRegexpEmptyMatch:            // always empty
    case kRegexpBeginLine:             // always empty, when they match
    case kRegexpEndLine:
    case kRegexpNoWordBoundary:
    case kRegexpWordBoundary:
    case kRegexpBeginText:
    case kRegexpEndText:
    case kRegexpStar:                  // can always be empty
    case kRegexpQuest:
    case kRegexpHaveMatch:
      return true;

    case kRegexpConcat:                // can be empty if all children can
      for (int i = 0; i < nchild_args; i++)
        if (!child_args[i])
          return false;
      return true;

    case kRegexpAlternate:             // can be empty if any child can
      for (int i = 0; i < nchild_args; i++)
        if (child_args[i])
          return true;
      return false;

    case kRegexpPlus:                  // can be empty if the child can
    case kRegexpCapture:
      return child_args[0];

    case kRegexpRepeat:                // can be empty if child can or is x{0}
      return child_args[0] || re->min() == 0;
  }
  return false;
}